

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::BNE(m6502 *this)

{
  uint8_t uVar1;
  m6502 *this_local;
  
  uVar1 = GetFlag(this,Z);
  if (uVar1 == '\0') {
    this->cycles = this->cycles + '\x01';
    this->addrAbs = this->pc + this->addrRel;
    if ((this->addrAbs & 0xff00) != (this->pc & 0xff00)) {
      this->cycles = this->cycles + '\x01';
    }
    this->pc = this->addrAbs;
  }
  return '\0';
}

Assistant:

uint8_t BNE()
  {
    if (GetFlag(Z) == 0)
    {
      ++cycles;
      addrAbs = pc + addrRel;
      if ((addrAbs & 0xFF00u) != (pc & 0xFF00u))
      {
        ++cycles;
      }
      pc = addrAbs;
    }
    return 0;
  }